

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O3

bool __thiscall cmFindProgramHelper::FileIsExecutableCMP0109(cmFindProgramHelper *this,string *file)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  PolicyID id;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_c0;
  string local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  if (this->PolicyCMP0109 - NEW < 3) {
    bVar1 = cmsys::SystemTools::FileIsExecutable(file);
    return bVar1;
  }
  if (this->PolicyCMP0109 != OLD) {
    bVar2 = cmsys::SystemTools::FileExists(file,true);
    bVar1 = cmsys::SystemTools::FileIsExecutable(file);
    if (bVar2 != bVar1) {
      this_00 = this->Makefile;
      local_80.second = &local_a0;
      if (bVar1) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a0,(cmPolicies *)0x6d,id);
        local_80.first._M_len = local_a0._M_string_length;
        local_80.first._M_str = local_a0._M_dataplus._M_p;
        local_68 = 0xc;
        local_60 = "\nThe file\n  ";
        local_58 = 0;
        local_48 = (file->_M_dataplus)._M_p;
        local_50 = file->_M_string_length;
        local_40 = 0;
        local_38 = 0x49;
        local_30 = "\nis executable but not readable.  CMake is ignoring it for compatibility.";
        local_28 = 0;
        views._M_len = 4;
        views._M_array = &local_80;
        cmCatViews(&local_c0,views);
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_c0);
      }
      else {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a0,(cmPolicies *)0x6d,id);
        local_80.first._M_len = local_a0._M_string_length;
        local_80.first._M_str = local_a0._M_dataplus._M_p;
        local_68 = 0xc;
        local_60 = "\nThe file\n  ";
        local_58 = 0;
        local_48 = (file->_M_dataplus)._M_p;
        local_50 = file->_M_string_length;
        local_40 = 0;
        local_38 = 0x46;
        local_30 = "\nis readable but not executable.  CMake is using it for compatibility.";
        local_28 = 0;
        views_00._M_len = 4;
        views_00._M_array = &local_80;
        cmCatViews(&local_c0,views_00);
        cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      bVar1 = bVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    return bVar1;
  }
  bVar1 = cmsys::SystemTools::FileExists(file,true);
  return bVar1;
}

Assistant:

bool FileIsExecutableCMP0109(std::string const& file) const
  {
    switch (this->PolicyCMP0109) {
      case cmPolicies::OLD:
        return cmSystemTools::FileExists(file, true);
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        return cmSystemTools::FileIsExecutable(file);
      default:
        break;
    }
    bool const isExeOld = cmSystemTools::FileExists(file, true);
    bool const isExeNew = cmSystemTools::FileIsExecutable(file);
    if (isExeNew == isExeOld) {
      return isExeNew;
    }
    if (isExeNew) {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is executable but not readable.  "
                 "CMake is ignoring it for compatibility."));
    } else {
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0109),
                 "\n"
                 "The file\n"
                 "  ",
                 file,
                 "\n"
                 "is readable but not executable.  "
                 "CMake is using it for compatibility."));
    }
    return isExeOld;
  }